

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse_new.cpp
# Opt level: O1

void __thiscall
matrix_sparse_row_test_const_subscript_operators_Test::
~matrix_sparse_row_test_const_subscript_operators_Test
          (matrix_sparse_row_test_const_subscript_operators_Test *this)

{
  pointer pdVar1;
  pointer piVar2;
  
  (this->super_matrix_sparse_row_test).super_Test._vptr_Test =
       (_func_int **)&PTR__matrix_sparse_row_test_001619f0;
  pdVar1 = (this->super_matrix_sparse_row_test).csr_data.value.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->super_matrix_sparse_row_test).csr_data.value.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  piVar2 = (this->super_matrix_sparse_row_test).csr_data.i_column.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->super_matrix_sparse_row_test).csr_data.i_column.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  piVar2 = (this->super_matrix_sparse_row_test).csr_data.row_offset.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->super_matrix_sparse_row_test).csr_data.row_offset.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x60);
  return;
}

Assistant:

TEST_F(matrix_sparse_row_test, const_subscript_operators) {
  const Matrix_Sparse_Row<double, int> row(&csr_data, csr_data.row_offset.begin() + 2);

  EXPECT_DOUBLE_EQ(row[1], 3.0);
  EXPECT_DOUBLE_EQ(row[3], 4.0);
  EXPECT_DOUBLE_EQ(row[4], 5.0);
  double remove_warning = 0;
  EXPECT_DEATH(remove_warning = row[0], "./*");
  EXPECT_DEATH(remove_warning = row[2], "./*");
  EXPECT_DEATH(remove_warning = row[5], "./*");
}